

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O0

void RK_Individual::criaCromossomos(Graph *g)

{
  bool bVar1;
  value_type __s;
  Edge *local_30;
  Edge *e;
  Vertex *v;
  value_type pCStack_18;
  int i;
  Chromosome *c;
  Graph *g_local;
  
  v._4_4_ = 0;
  c = (Chromosome *)g;
  for (e = (Edge *)Graph::get_verticesList(g); e != (Edge *)0x0;
      e = (Edge *)Vertex::getNext((Vertex *)e)) {
    for (local_30 = Vertex::getEdgesList((Vertex *)e); local_30 != (Edge *)0x0;
        local_30 = Edge::getNext(local_30)) {
      bVar1 = Edge::getModifiable(local_30);
      if (bVar1) {
        bVar1 = Edge::getMarked(local_30);
        if (bVar1) {
          __s = (value_type)operator_new(0x18);
          memset(__s,0,0x18);
          __s->edge = local_30;
          __s->weight = 0.0;
          __s->position = v._4_4_;
          pCStack_18 = __s;
          std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::push_back
                    (&cromossomos,&stack0xffffffffffffffe8);
          v._4_4_ = v._4_4_ + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void RK_Individual::criaCromossomos(Graph *g){
    Chromosome *c;
    int i = 0;
    for(Vertex *v = g->get_verticesList(); v != NULL; v= v->getNext()){

        for(Edge *e = v->getEdgesList(); e != NULL; e= e->getNext()){

            /**individuo possui somente arcos modificaveis e em um sentido
            (antes tinhamos arcos a-b e b-a, agora usamos somente um deles)**/
            if(e->getModifiable() == true && e->getMarked() == true){
                c = new Chromosome();
                c->edge = e;
                c->weight = 0;
                c->position = i;
                cromossomos.push_back(c);
                i++;
            }
        }

    }
}